

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

void __thiscall
ot::commissioner::coap::Coap::ReceiveMessage
          (Coap *this,Endpoint *aEndpoint,shared_ptr<ot::commissioner::coap::Message> *aMessage,
          Error *error)

{
  Request *aResponse;
  char *pcVar1;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *from;
  bool bVar2;
  format_args args;
  string_view fmt;
  writer write;
  string local_b0;
  string local_90;
  writer local_70;
  pointer local_68;
  char *pcStack_60;
  size_t local_58;
  undefined8 local_50;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  code *local_40;
  
  if (error->mCode == kNone) {
    aResponse = (aMessage->
                super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    if (aResponse == (Request *)0x0) {
      __assert_fail("condition",
                    "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/coap.cpp"
                    ,0x277,
                    "void ot::commissioner::coap::Coap::ReceiveMessage(Endpoint &, std::shared_ptr<Message>, Error)"
                   );
    }
    aResponse->mEndpoint = aEndpoint;
    if ((byte)((aResponse->mHeader).mCode - 1) < 4) {
      HandleRequest(this,aResponse);
      return;
    }
    HandleResponse(this,aResponse);
    return;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"coap","");
  local_68 = (pointer)CONCAT44(local_68._4_4_,string_type);
  from = "drop a CoAP message in bad format: {}";
  pcStack_60 = "drop a CoAP message in bad format: {}";
  local_58 = 0x25;
  local_50._0_4_ = 0;
  local_50._4_4_ = 1;
  local_40 = ::fmt::v10::detail::
             parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
  local_70.handler_ =
       (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)&local_68;
  local_48 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_68;
  do {
    if (from == "") break;
    to = from;
    if (*from == '{') {
LAB_0014fb61:
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&local_70,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                       (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_68);
      bVar2 = true;
    }
    else {
      to = from + 1;
      bVar2 = to != "";
      if (bVar2) {
        if (*to != '{') {
          pcVar1 = from + 2;
          do {
            to = pcVar1;
            bVar2 = to != "";
            if (to == "") goto LAB_0014fb5d;
            pcVar1 = to + 1;
          } while (*to != '{');
        }
        bVar2 = true;
      }
LAB_0014fb5d:
      if (bVar2) goto LAB_0014fb61;
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::writer::operator()(&local_70,from,"");
      bVar2 = false;
    }
  } while (bVar2);
  local_68 = (error->mMessage)._M_dataplus._M_p;
  pcStack_60 = (char *)(error->mMessage)._M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_68;
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x25;
  ::fmt::v10::vformat_abi_cxx11_(&local_90,(v10 *)"drop a CoAP message in bad format: {}",fmt,args);
  Log(kInfo,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

Error Message::GetOption(ByteArray &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetOpaqueValue();

exit:
    return error;
}